

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O1

void __thiscall
icu_63::RegexCompile::compileInterval(RegexCompile *this,int32_t InitOp,int32_t LoopOp)

{
  int32_t iVar1;
  int32_t iVar2;
  
  iVar1 = blockTopLoc(this,'\x01');
  insertOp(this,iVar1);
  insertOp(this,iVar1);
  insertOp(this,iVar1);
  iVar2 = allocateStackData(this,1 - (this->fIntervalUpper >> 0x1f));
  iVar2 = buildOp(this,InitOp,iVar2);
  UVector64::setElementAt(this->fRXPat->fCompiledPat,(long)iVar2,iVar1);
  iVar2 = buildOp(this,0x1f,this->fRXPat->fCompiledPat->count);
  UVector64::setElementAt(this->fRXPat->fCompiledPat,(long)iVar2,iVar1 + 1);
  UVector64::setElementAt(this->fRXPat->fCompiledPat,(long)this->fIntervalLow,iVar1 + 2);
  UVector64::setElementAt(this->fRXPat->fCompiledPat,(long)this->fIntervalUpper,iVar1 + 3);
  iVar1 = buildOp(this,LoopOp,iVar1);
  appendOp(this,iVar1);
  if ((0xffffff < (uint)this->fIntervalLow) || (0xffffff < this->fIntervalUpper)) {
    error(this,U_REGEX_NUMBER_TOO_BIG);
  }
  if (this->fIntervalUpper == -1 || this->fIntervalLow <= this->fIntervalUpper) {
    return;
  }
  error(this,U_REGEX_MAX_LT_MIN);
  return;
}

Assistant:

void        RegexCompile::compileInterval(int32_t InitOp,  int32_t LoopOp)
{
    // The CTR_INIT op at the top of the block with the {n,m} quantifier takes
    //   four slots in the compiled code.  Reserve them.
    int32_t   topOfBlock = blockTopLoc(TRUE);
    insertOp(topOfBlock);
    insertOp(topOfBlock);
    insertOp(topOfBlock);

    // The operands for the CTR_INIT opcode include the index in the matcher data
    //   of the counter.  Allocate it now. There are two data items
    //        counterLoc   -->  Loop counter
    //               +1    -->  Input index (for breaking non-progressing loops)
    //                          (Only present if unbounded upper limit on loop)
    int32_t   dataSize = fIntervalUpper < 0 ? 2 : 1;
    int32_t   counterLoc = allocateStackData(dataSize);

    int32_t   op = buildOp(InitOp, counterLoc);
    fRXPat->fCompiledPat->setElementAt(op, topOfBlock);

    // The second operand of CTR_INIT is the location following the end of the loop.
    //   Must put in as a URX_RELOC_OPRND so that the value will be adjusted if the
    //   compilation of something later on causes the code to grow and the target
    //   position to move.
    int32_t loopEnd = fRXPat->fCompiledPat->size();
    op = buildOp(URX_RELOC_OPRND, loopEnd);
    fRXPat->fCompiledPat->setElementAt(op, topOfBlock+1);

    // Followed by the min and max counts.
    fRXPat->fCompiledPat->setElementAt(fIntervalLow, topOfBlock+2);
    fRXPat->fCompiledPat->setElementAt(fIntervalUpper, topOfBlock+3);

    // Apend the CTR_LOOP op.  The operand is the location of the CTR_INIT op.
    //   Goes at end of the block being looped over, so just append to the code so far.
    appendOp(LoopOp, topOfBlock);

    if ((fIntervalLow & 0xff000000) != 0 ||
        (fIntervalUpper > 0 && (fIntervalUpper & 0xff000000) != 0)) {
            error(U_REGEX_NUMBER_TOO_BIG);
        }

    if (fIntervalLow > fIntervalUpper && fIntervalUpper != -1) {
        error(U_REGEX_MAX_LT_MIN);
    }
}